

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_color_picker
               (nk_command_buffer *o,nk_rect *matrix,nk_rect *hue_bar,nk_rect *alpha_bar,
               nk_colorf col)

{
  float fVar1;
  nk_color nVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  nk_rect rect;
  float local_bc;
  float local_b8;
  float local_b4;
  float V;
  float S;
  nk_vec2 p;
  float alpha;
  int local_60;
  int i;
  float line_y;
  float hsva [4];
  nk_color temp;
  float crosshair_size;
  nk_rect *alpha_bar_local;
  nk_rect *hue_bar_local;
  nk_rect *matrix_local;
  nk_command_buffer *o_local;
  nk_colorf col_local;
  
  col_local.g = col.a;
  if (o == (nk_command_buffer *)0x0) {
    __assert_fail("o",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5e7b,
                  "void nk_draw_color_picker(struct nk_command_buffer *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf)"
                 );
  }
  if (matrix != (nk_rect *)0x0) {
    if (hue_bar != (nk_rect *)0x0) {
      nk_colorf_hsva_fv((float *)&i,col);
      for (local_60 = 0; local_60 < 6; local_60 = local_60 + 1) {
        fVar5 = hue_bar->h / 6.0;
        rect = nk_rect(hue_bar->x,(float)local_60 * fVar5 + hue_bar->y + 0.5,hue_bar->w,fVar5 + 0.5)
        ;
        nk_fill_rect_multi_color
                  (o,rect,nk_draw_color_picker::hue_colors[local_60],
                   nk_draw_color_picker::hue_colors[local_60],
                   nk_draw_color_picker::hue_colors[local_60 + 1],
                   nk_draw_color_picker::hue_colors[local_60 + 1]);
      }
      fVar3 = (float)(int)((float)i * matrix->h + hue_bar->y + 0.5);
      fVar5 = hue_bar->x;
      fVar4 = hue_bar->x;
      fVar1 = hue_bar->w;
      nVar2 = nk_rgb(0xff,0xff,0xff);
      nk_stroke_line(o,fVar5 - 1.0,fVar3,fVar4 + fVar1 + 2.0,fVar3,1.0,nVar2);
      if (alpha_bar != (nk_rect *)0x0) {
        if (col_local.g <= 1.0) {
          local_b4 = col_local.g;
        }
        else {
          local_b4 = 1.0;
        }
        if (local_b4 <= 0.0) {
          local_bc = 0.0;
        }
        else {
          if (col_local.g <= 1.0) {
            local_b8 = col_local.g;
          }
          else {
            local_b8 = 1.0;
          }
          local_bc = local_b8;
        }
        fVar3 = (float)(int)((1.0 - local_bc) * matrix->h + alpha_bar->y + 0.5);
        nk_fill_rect_multi_color
                  (o,*alpha_bar,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
                   (nk_color)0xff000000);
        fVar5 = alpha_bar->x;
        fVar4 = alpha_bar->x;
        fVar1 = alpha_bar->w;
        nVar2 = nk_rgb(0xff,0xff,0xff);
        nk_stroke_line(o,fVar5 - 1.0,fVar3,fVar4 + fVar1 + 2.0,fVar3,1.0,nVar2);
      }
      nVar2 = nk_hsv_f((float)i,1.0,1.0);
      nk_fill_rect_multi_color(o,*matrix,(nk_color)0xffffffff,nVar2,nVar2,(nk_color)0xffffffff);
      nk_fill_rect_multi_color
                (o,*matrix,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
      fVar5 = (float)(int)(line_y * matrix->w + matrix->x);
      fVar4 = (float)(int)((1.0 - hsva[0]) * matrix->h + matrix->y);
      nk_stroke_line(o,fVar5 - 7.0,fVar4,fVar5 - 2.0,fVar4,1.0,(nk_color)0xffffffff);
      nk_stroke_line(o,fVar5 + 7.0 + 1.0,fVar4,fVar5 + 3.0,fVar4,1.0,(nk_color)0xffffffff);
      nk_stroke_line(o,fVar5,fVar4 + 7.0 + 1.0,fVar5,fVar4 + 3.0,1.0,(nk_color)0xffffffff);
      nk_stroke_line(o,fVar5,fVar4 - 7.0,fVar5,fVar4 - 2.0,1.0,(nk_color)0xffffffff);
      return;
    }
    __assert_fail("hue_bar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5e7d,
                  "void nk_draw_color_picker(struct nk_command_buffer *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf)"
                 );
  }
  __assert_fail("matrix",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x5e7c,
                "void nk_draw_color_picker(struct nk_command_buffer *, const struct nk_rect *, const struct nk_rect *, const struct nk_rect *, struct nk_colorf)"
               );
}

Assistant:

NK_LIB void
nk_draw_color_picker(struct nk_command_buffer *o, const struct nk_rect *matrix,
    const struct nk_rect *hue_bar, const struct nk_rect *alpha_bar,
    struct nk_colorf col)
{
    NK_STORAGE const struct nk_color black = {0,0,0,255};
    NK_STORAGE const struct nk_color white = {255, 255, 255, 255};
    NK_STORAGE const struct nk_color black_trans = {0,0,0,0};

    const float crosshair_size = 7.0f;
    struct nk_color temp;
    float hsva[4];
    float line_y;
    int i;

    NK_ASSERT(o);
    NK_ASSERT(matrix);
    NK_ASSERT(hue_bar);

    /* draw hue bar */
    nk_colorf_hsva_fv(hsva, col);
    for (i = 0; i < 6; ++i) {
        NK_GLOBAL const struct nk_color hue_colors[] = {
            {255, 0, 0, 255}, {255,255,0,255}, {0,255,0,255}, {0, 255,255,255},
            {0,0,255,255}, {255, 0, 255, 255}, {255, 0, 0, 255}
        };
        nk_fill_rect_multi_color(o,
            nk_rect(hue_bar->x, hue_bar->y + (float)i * (hue_bar->h/6.0f) + 0.5f,
                hue_bar->w, (hue_bar->h/6.0f) + 0.5f), hue_colors[i], hue_colors[i],
                hue_colors[i+1], hue_colors[i+1]);
    }
    line_y = (float)(int)(hue_bar->y + hsva[0] * matrix->h + 0.5f);
    nk_stroke_line(o, hue_bar->x-1, line_y, hue_bar->x + hue_bar->w + 2,
        line_y, 1, nk_rgb(255,255,255));

    /* draw alpha bar */
    if (alpha_bar) {
        float alpha = NK_SATURATE(col.a);
        line_y = (float)(int)(alpha_bar->y +  (1.0f - alpha) * matrix->h + 0.5f);

        nk_fill_rect_multi_color(o, *alpha_bar, white, white, black, black);
        nk_stroke_line(o, alpha_bar->x-1, line_y, alpha_bar->x + alpha_bar->w + 2,
            line_y, 1, nk_rgb(255,255,255));
    }

    /* draw color matrix */
    temp = nk_hsv_f(hsva[0], 1.0f, 1.0f);
    nk_fill_rect_multi_color(o, *matrix, white, temp, temp, white);
    nk_fill_rect_multi_color(o, *matrix, black_trans, black_trans, black, black);

    /* draw cross-hair */
    {struct nk_vec2 p; float S = hsva[1]; float V = hsva[2];
    p.x = (float)(int)(matrix->x + S * matrix->w);
    p.y = (float)(int)(matrix->y + (1.0f - V) * matrix->h);
    nk_stroke_line(o, p.x - crosshair_size, p.y, p.x-2, p.y, 1.0f, white);
    nk_stroke_line(o, p.x + crosshair_size + 1, p.y, p.x+3, p.y, 1.0f, white);
    nk_stroke_line(o, p.x, p.y + crosshair_size + 1, p.x, p.y+3, 1.0f, white);
    nk_stroke_line(o, p.x, p.y - crosshair_size, p.x, p.y-2, 1.0f, white);}
}